

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

void __thiscall
soul::SourceCodeOperations::removeProcessor(SourceCodeOperations *this,ProcessorBase *p)

{
  ModuleDeclaration *pMVar1;
  CodeLocation local_28;
  CodeLocation local_18;
  
  pMVar1 = findDeclaration(this,&p->super_ModuleBase);
  if (pMVar1 != (ModuleDeclaration *)0x0) {
    local_28.sourceCode.object = (pMVar1->startIncludingPreamble).sourceCode.object;
    if (local_28.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_28.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_28.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_28.location.data = (pMVar1->startIncludingPreamble).location.data;
    local_18.sourceCode.object = (pMVar1->endOfClosingBrace).sourceCode.object;
    if (local_18.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_18.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_18.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_18.location.data = (pMVar1->endOfClosingBrace).location.data;
    deleteText(this,&local_28,&local_18);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_18.sourceCode);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_28.sourceCode);
    reparse(this);
    return;
  }
  throwInternalCompilerError("d != nullptr","removeProcessor",0x30);
}

Assistant:

void SourceCodeOperations::removeProcessor (AST::ProcessorBase& p)
{
    auto d = findDeclaration (p);
    SOUL_ASSERT (d != nullptr);
    deleteText (d->startIncludingPreamble, d->endOfClosingBrace);
    reparse();
}